

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

void __thiscall
TreePropagator::DFSBlue
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *visited,int *count)

{
  ulong *puVar1;
  uint uVar2;
  BoolView *pBVar3;
  uint *puVar4;
  int iVar5;
  pointer pvVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  pointer piVar12;
  
  uVar7 = (ulong)r;
  iVar5 = r + 0x3f;
  if (-1 < r) {
    iVar5 = r;
  }
  puVar1 = (visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           (long)(iVar5 >> 6) +
           (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)r & 0x3f);
  *count = *count + 1;
  pvVar6 = (this->super_GraphPropagator).adj.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar12 = pvVar6[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar6[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar12) {
    uVar9 = 1;
    uVar10 = 0;
    pcVar8 = sat.assigns.data;
    do {
      uVar2 = piVar12[uVar10];
      pBVar3 = (this->super_GraphPropagator).es.data;
      if ((pcVar8[(uint)pBVar3[uVar2].v] == '\0') ||
         ((uint)pBVar3[uVar2].s * 2 + -1 != (int)pcVar8[(uint)pBVar3[uVar2].v])) {
        pBVar3 = (this->super_GraphPropagator).vs.data;
        puVar4 = *(uint **)&(this->super_GraphPropagator).endnodes.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
        uVar2 = *puVar4;
        if (uVar2 == r) {
          uVar2 = puVar4[1];
        }
        if ((pcVar8[(uint)pBVar3[uVar2].v] == '\0') ||
           ((uint)pBVar3[uVar2].s * 2 + -1 != (int)pcVar8[(uint)pBVar3[uVar2].v])) {
          uVar11 = uVar2 + 0x3f;
          if (-1 < (int)uVar2) {
            uVar11 = uVar2;
          }
          if (((visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)((int)uVar11 >> 6) +
                (ulong)(((long)(int)uVar2 & 0x800000000000003fU) < 0x8000000000000001) +
                0xffffffffffffffff] >> ((long)(int)uVar2 & 0x3fU) & 1) == 0) {
            DFSBlue(this,uVar2,visited,count);
            pvVar6 = (this->super_GraphPropagator).adj.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar8 = sat.assigns.data;
          }
        }
      }
      uVar10 = (ulong)uVar9;
      piVar12 = pvVar6[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    } while (uVar10 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar6[uVar7].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + 8) - (long)piVar12 >> 2));
  }
  return;
}

Assistant:

void TreePropagator::DFSBlue(int r, std::vector<bool>& visited, int& count) {
	visited[r] = true;
	count++;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			continue;
		}
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (getNodeVar(other).isFixed() && getNodeVar(other).isFalse()) {
			continue;
		}
		if (visited[other] == false) {
			DFSBlue(other, visited, count);
		}
	}
}